

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O3

int __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::removeScaleFactors
          (BeagleCPUImpl<double,_1,_0> *this,int *scalingIndices,int count,
          int cumulativeScalingIndex)

{
  double *pdVar1;
  double *pdVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  double dVar6;
  
  if (0 < count) {
    uVar5 = 0;
    pdVar1 = this->gScaleBuffers[cumulativeScalingIndex];
    iVar3 = this->kPatternCount;
    do {
      if (0 < iVar3) {
        lVar4 = 0;
        pdVar2 = this->gScaleBuffers[scalingIndices[uVar5]];
        do {
          if ((this->kFlags & 0x400) == 0) {
            dVar6 = log(pdVar2[lVar4]);
            pdVar1[lVar4] = pdVar1[lVar4] - dVar6;
            iVar3 = this->kPatternCount;
          }
          else {
            pdVar1[lVar4] = pdVar1[lVar4] - pdVar2[lVar4];
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < iVar3);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 != (uint)count);
  }
  return 0;
}

Assistant:

BEAGLE_CPU_TEMPLATE
int BeagleCPUImpl<BEAGLE_CPU_GENERIC>::removeScaleFactors(const int* scalingIndices,
                                                          int  count,
                                                          int  cumulativeScalingIndex) {
    REALTYPE* cumulativeScaleBuffer = gScaleBuffers[cumulativeScalingIndex];
    for(int i=0; i<count; i++) {
        const REALTYPE* scaleBuffer = gScaleBuffers[scalingIndices[i]];
        for(int j=0; j<kPatternCount; j++) {
            if (kFlags & BEAGLE_FLAG_SCALERS_LOG)
                cumulativeScaleBuffer[j] -= scaleBuffer[j];
            else
                cumulativeScaleBuffer[j] -= log(scaleBuffer[j]);
        }
    }

    return BEAGLE_SUCCESS;
}